

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibLut.c
# Opt level: O3

int If_LibLutDelaysAreDifferent(If_LibLut_t *pLutLib)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  float (*pafVar6) [33];
  
  fVar1 = pLutLib->pLutDelays[1][0];
  uVar3 = pLutLib->LutMax;
  if (pLutLib->fVarPinDelays == 0) {
    if (1 < (int)uVar3) {
      lVar5 = 0;
      do {
        fVar2 = *(float *)((long)pLutLib->pLutDelays[2] + lVar5);
        if ((fVar2 != fVar1) || (NAN(fVar2) || NAN(fVar1))) {
          return 1;
        }
        lVar5 = lVar5 + 0x84;
      } while ((ulong)uVar3 * 0x84 + -0x84 != lVar5);
    }
  }
  else if (1 < (int)uVar3) {
    pafVar6 = pLutLib->pLutDelays + 2;
    lVar5 = 2;
    do {
      lVar4 = 0;
      do {
        if ((*pafVar6)[lVar4] != fVar1) {
          return 1;
        }
        if (NAN((*pafVar6)[lVar4]) || NAN(fVar1)) {
          return 1;
        }
        lVar4 = lVar4 + 1;
      } while (lVar5 != lVar4);
      lVar5 = lVar5 + 1;
      pafVar6 = pafVar6 + 1;
      if (lVar5 == (ulong)uVar3 + 1) {
        return 0;
      }
    } while( true );
  }
  return 0;
}

Assistant:

int If_LibLutDelaysAreDifferent( If_LibLut_t * pLutLib )
{
    int i, k;
    float Delay = pLutLib->pLutDelays[1][0];
    if ( pLutLib->fVarPinDelays )
    {
        for ( i = 2; i <= pLutLib->LutMax; i++ )
        for ( k = 0; k < i; k++ )
            if ( pLutLib->pLutDelays[i][k] != Delay )
                return 1;
    }
    else
    {
        for ( i = 2; i <= pLutLib->LutMax; i++ )
            if ( pLutLib->pLutDelays[i][0] != Delay )
                return 1;
    }
    return 0;
}